

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool httplib::detail::read_headers(Stream *strm,Headers *headers)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __ssize_t _Var2;
  _Alloc_hider beg;
  FILE *in_RCX;
  size_t *in_RDX;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  bool bVar3;
  Headers *__lineptr;
  stream_line_reader line_reader;
  char buf [2048];
  stream_line_reader local_858;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_818 [128];
  
  paVar1 = &local_858.glowable_buffer_.field_2;
  local_858.fixed_buffer_ = (char *)local_818;
  local_858.fixed_buffer_size_ = 0x800;
  local_858.fixed_buffer_used_size_ = 0;
  local_858.glowable_buffer_._M_string_length = 0;
  local_858.glowable_buffer_.field_2._M_local_buf[0] = '\0';
  __lineptr = headers;
  local_858.strm_ = strm;
  local_858.glowable_buffer_._M_dataplus._M_p = (pointer)paVar1;
  while( true ) {
    _Var2 = stream_line_reader::getline(&local_858,(char **)__lineptr,in_RDX,in_RCX);
    if ((char)_Var2 == '\0') break;
    beg._M_p = local_858.glowable_buffer_._M_dataplus._M_p;
    in_RCX = (FILE *)local_858.glowable_buffer_._M_string_length;
    if ((FILE *)local_858.glowable_buffer_._M_string_length == (FILE *)0x0) {
      beg._M_p = local_858.fixed_buffer_;
      in_RCX = (FILE *)local_858.fixed_buffer_used_size_;
    }
    in_RDX = extraout_RDX;
    if ((((FILE *)0x1 < in_RCX) &&
        (__lineptr = (Headers *)(beg._M_p + (long)in_RCX),
        *(char *)((long)&__lineptr[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count + 6) == '\r'
        )) && (*(char *)((long)&__lineptr[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
               == '\n')) {
      if (in_RCX == (FILE *)0x2) {
        bVar3 = true;
        goto LAB_0013e021;
      }
      if ((FILE *)0x2000 < in_RCX) break;
      __lineptr = (Headers *)
                  ((long)&__lineptr[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count + 6);
      parse_header<httplib::detail::read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
                (beg._M_p,(char *)__lineptr,(anon_class_8_1_b2c1a266)headers);
      in_RDX = extraout_RDX_00;
    }
  }
  bVar3 = false;
LAB_0013e021:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858.glowable_buffer_._M_dataplus._M_p != paVar1) {
    operator_delete(local_858.glowable_buffer_._M_dataplus._M_p,
                    CONCAT71(local_858.glowable_buffer_.field_2._M_allocated_capacity._1_7_,
                             local_858.glowable_buffer_.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

inline bool read_headers(Stream &strm, Headers &headers) {
  const auto bufsiz = 2048;
  char buf[bufsiz];
  stream_line_reader line_reader(strm, buf, bufsiz);

  for (;;) {
    if (!line_reader.getline()) { return false; }

    // Check if the line ends with CRLF.
    auto line_terminator_len = 2;
    if (line_reader.end_with_crlf()) {
      // Blank line indicates end of headers.
      if (line_reader.size() == 2) { break; }
#ifdef CPPHTTPLIB_ALLOW_LF_AS_LINE_TERMINATOR
    } else {
      // Blank line indicates end of headers.
      if (line_reader.size() == 1) { break; }
      line_terminator_len = 1;
    }
#else
    } else {
      continue; // Skip invalid line.
    }